

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void GetStatistics(ZopfliLZ77Store *store,SymbolStats *stats)

{
  int iVar1;
  ulong uVar2;
  long in_RSI;
  long *in_RDI;
  size_t i;
  ulong local_18;
  
  for (local_18 = 0; local_18 < (ulong)in_RDI[2]; local_18 = local_18 + 1) {
    if (*(short *)(in_RDI[1] + local_18 * 2) == 0) {
      uVar2 = (ulong)*(ushort *)(*in_RDI + local_18 * 2);
      *(long *)(in_RSI + uVar2 * 8) = *(long *)(in_RSI + uVar2 * 8) + 1;
    }
    else {
      iVar1 = ZopfliGetLengthSymbol((uint)*(ushort *)(*in_RDI + local_18 * 2));
      *(long *)(in_RSI + (long)iVar1 * 8) = *(long *)(in_RSI + (long)iVar1 * 8) + 1;
      iVar1 = ZopfliGetDistSymbol((uint)*(ushort *)(in_RDI[1] + local_18 * 2));
      *(long *)(in_RSI + 0x900 + (long)iVar1 * 8) = *(long *)(in_RSI + 0x900 + (long)iVar1 * 8) + 1;
    }
  }
  *(undefined8 *)(in_RSI + 0x800) = 1;
  CalculateStatistics((SymbolStats *)0x10a318);
  return;
}

Assistant:

static void GetStatistics(const ZopfliLZ77Store* store, SymbolStats* stats) {
  size_t i;
  for (i = 0; i < store->size; i++) {
    if (store->dists[i] == 0) {
      stats->litlens[store->litlens[i]]++;
    } else {
      stats->litlens[ZopfliGetLengthSymbol(store->litlens[i])]++;
      stats->dists[ZopfliGetDistSymbol(store->dists[i])]++;
    }
  }
  stats->litlens[256] = 1;  /* End symbol. */

  CalculateStatistics(stats);
}